

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launcher.cxx
# Opt level: O2

int __thiscall nuraft::raft_launcher::shutdown(raft_launcher *this,int __fd,int __how)

{
  raft_server *this_00;
  element_type *peVar1;
  uint32_t uVar2;
  int iVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  
  this_00 = (this->raft_instance_).
            super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (raft_server *)0x0) {
    iVar3 = 0;
  }
  else {
    raft_server::shutdown(this_00,__fd,__how);
    std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->raft_instance_).
                super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>);
    peVar1 = (this->asio_listener_).
             super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      (*peVar1->_vptr_rpc_listener[3])();
      (*((this->asio_listener_).super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_vptr_rpc_listener[4])();
    }
    asio_service::stop((this->asio_svc_).
                       super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar4 = 0;
    while( true ) {
      uVar2 = asio_service::get_active_workers
                        ((this->asio_svc_).
                         super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        );
      if ((uVar2 == 0) || ((ulong)(CONCAT44(in_register_00000034,__fd) * 100) <= uVar4)) break;
      timer_helper::sleep_ms(10);
      uVar4 = uVar4 + 1;
    }
    uVar2 = asio_service::get_active_workers
                      ((this->asio_svc_).
                       super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar3 = CONCAT31((int3)(uVar2 >> 8),uVar2 == 0);
  }
  return iVar3;
}

Assistant:

bool raft_launcher::shutdown(size_t time_limit_sec) {
    if (!raft_instance_) return false;

    raft_instance_->shutdown();
    raft_instance_.reset();

    if (asio_listener_) {
        asio_listener_->stop();
        asio_listener_->shutdown();
    }
    if (asio_svc_) {
        asio_svc_->stop();
        size_t count = 0;
        while ( asio_svc_->get_active_workers() &&
                count < time_limit_sec * 100 ) {
            // 10ms per tick.
            timer_helper::sleep_ms(10);
            count++;
        }
    }
    if (asio_svc_->get_active_workers()) return false;
    return true;
}